

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O2

int fits_rdecomp_byte(uchar *c,int clen,uchar *array,int nx,int nblock)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  byte *pbVar8;
  char *err_message;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  
  uVar7 = (uint)*c;
  uVar11 = (uint)c[1];
  pbVar8 = c + 2;
  lVar14 = 0;
  iVar4 = 8;
  do {
    iVar10 = (int)lVar14;
    if (nx <= iVar10) {
      iVar4 = 0;
      if (c + clen <= pbVar8) {
        return 0;
      }
      err_message = "decompression warning: unused bytes at end of compressed buffer";
      goto LAB_001ada3e;
    }
    iVar9 = iVar4 + -0xb;
    for (iVar4 = iVar4 + -3; iVar4 < 0; iVar4 = iVar4 + 8) {
      bVar1 = *pbVar8;
      pbVar8 = pbVar8 + 1;
      uVar11 = uVar11 << 8 | (uint)bVar1;
      iVar9 = iVar9 + 8;
    }
    uVar5 = uVar11 >> ((byte)iVar4 & 0x1f);
    uVar12 = ~(-1 << ((byte)iVar4 & 0x1f));
    uVar11 = uVar11 & uVar12;
    iVar3 = nblock + iVar10;
    if (nx <= nblock + iVar10) {
      iVar3 = nx;
    }
    iVar6 = uVar5 - 1;
    lVar13 = (long)iVar3;
    if (iVar6 < 0) {
      for (lVar14 = (long)iVar10; lVar14 < lVar13; lVar14 = lVar14 + 1) {
        array[lVar14] = (uchar)uVar7;
      }
    }
    else if (iVar6 == 6) {
      for (lVar14 = (long)iVar10; lVar14 < lVar13; lVar14 = lVar14 + 1) {
        bVar1 = -(char)iVar9 & 0x1f;
        uVar5 = uVar11 << bVar1;
        iVar10 = -iVar4;
        while (-1 < iVar10) {
          bVar2 = *pbVar8;
          pbVar8 = pbVar8 + 1;
          uVar5 = uVar5 | bVar2;
          iVar10 = -8;
        }
        if (iVar4 == 0) {
          uVar11 = 0 << bVar1;
        }
        else {
          bVar1 = *pbVar8;
          pbVar8 = pbVar8 + 1;
          uVar5 = uVar5 | bVar1 >> (-(char)iVar10 & 0x1fU);
          uVar11 = bVar1 & uVar12;
        }
        uVar7 = uVar7 + (-(uVar5 & 1) ^ uVar5 >> 1);
        array[lVar14] = (uchar)uVar7;
      }
    }
    else {
      for (lVar14 = (long)iVar10; lVar14 < lVar13; lVar14 = lVar14 + 1) {
        while (uVar11 == 0) {
          iVar4 = iVar4 + 8;
          bVar1 = *pbVar8;
          pbVar8 = pbVar8 + 1;
          uVar11 = (uint)bVar1;
        }
        iVar10 = iVar4 - nonzero_count[uVar11];
        uVar5 = nonzero_count[uVar11] - 1;
        uVar11 = uVar11 ^ 1 << (uVar5 & 0x1f);
        for (iVar4 = uVar5 - iVar6; iVar4 < 0; iVar4 = iVar4 + 8) {
          bVar1 = *pbVar8;
          pbVar8 = pbVar8 + 1;
          uVar11 = uVar11 << 8 | (uint)bVar1;
        }
        uVar5 = uVar11 >> ((byte)iVar4 & 0x1f) | iVar10 << ((byte)iVar6 & 0x1f);
        uVar11 = uVar11 & ~(-1 << ((byte)iVar4 & 0x1f));
        uVar7 = uVar7 + (-(uVar5 & 1) ^ uVar5 >> 1);
        array[lVar14] = (uchar)uVar7;
      }
    }
  } while (pbVar8 <= c + clen);
  iVar4 = 1;
  err_message = "decompression error: hit end of compressed byte stream";
LAB_001ada3e:
  ffpmsg(err_message);
  return iVar4;
}

Assistant:

int fits_rdecomp_byte (unsigned char *c,		/* input buffer			*/
	     int clen,			/* length of input		*/
	     unsigned char array[],  	/* output array			*/
	     int nx,			/* number of output pixels	*/
	     int nblock)		/* coding block size		*/
{
int i, imax;
/* int bsize; */
int k;
int nbits, nzero, fs;
unsigned char *cend;
unsigned int b, diff, lastpix;
int fsmax, fsbits, bbits;
extern const int nonzero_count[];

   /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */

/*    bsize = 1; */
    
/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return 1;
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 3;
    fsmax = 6;

    bbits = 1<<fsbits;

    /*
     * Decode in blocks of nblock pixels
     */

    /* first byte of input buffer contain the value of the first */
    /* byte integer value, without any encoding */
    
    lastpix = c[0];
    c += 1;  
    cend = c + clen - 1;

    b = *c++;		    /* bit buffer			*/
    nbits = 8;		    /* number of bits remaining in b	*/
    for (i = 0; i<nx; ) {
	/* get the FS value from first fsbits */
	nbits -= fsbits;
	while (nbits < 0) {
	    b = (b<<8) | (*c++);
	    nbits += 8;
	}
	fs = (b >> nbits) - 1;

	b &= (1<<nbits)-1;
	/* loop over the next block */
	imax = i + nblock;
	if (imax > nx) imax = nx;
	if (fs<0) {
	    /* low-entropy case, all zero differences */
	    for ( ; i<imax; i++) array[i] = lastpix;
	} else if (fs==fsmax) {
	    /* high-entropy case, directly coded pixel values */
	    for ( ; i<imax; i++) {
		k = bbits - nbits;
		diff = b<<k;
		for (k -= 8; k >= 0; k -= 8) {
		    b = *c++;
		    diff |= b<<k;
		}
		if (nbits>0) {
		    b = *c++;
		    diff |= b>>(-k);
		    b &= (1<<nbits)-1;
		} else {
		    b = 0;
		}
   
		/*
		 * undo mapping and differencing
		 * Note that some of these operations will overflow the
		 * unsigned int arithmetic -- that's OK, it all works
		 * out to give the right answers in the output file.
		 */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	} else {
	    /* normal case, Rice coding */
	    for ( ; i<imax; i++) {
		/* count number of leading zeros */
		while (b == 0) {
		    nbits += 8;
		    b = *c++;
		}
		nzero = nbits - nonzero_count[b];
		nbits -= nzero+1;
		/* flip the leading one-bit */
		b ^= 1<<nbits;
		/* get the FS trailing bits */
		nbits -= fs;
		while (nbits < 0) {
		    b = (b<<8) | (*c++);
		    nbits += 8;
		}
		diff = (nzero<<fs) | (b>>nbits);
		b &= (1<<nbits)-1;

		/* undo mapping and differencing */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	}
	if (c > cend) {
            ffpmsg("decompression error: hit end of compressed byte stream");
	    return 1;
	}
    }
    if (c < cend) {
        ffpmsg("decompression warning: unused bytes at end of compressed buffer");
    }
    return 0;
}